

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginOperatorInterface.cpp
# Opt level: O2

void __thiscall
adios2::plugin::PluginOperatorInterface::PluginOperatorInterface
          (PluginOperatorInterface *this,Params *parameters)

{
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"PluginInterface",&local_51);
  std::__cxx11::string::string((string *)&local_50,"plugin",&local_52);
  core::Operator::Operator(&this->super_Operator,&local_30,PLUGIN_INTERFACE,&local_50,parameters);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Operator)._vptr_Operator = (_func_int **)&PTR__Operator_00821940;
  return;
}

Assistant:

PluginOperatorInterface::PluginOperatorInterface(const Params &parameters)
: Operator("PluginInterface", PLUGIN_INTERFACE, "plugin", parameters)
{
}